

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.cpp
# Opt level: O3

void __thiscall
icu_63::Norms::reorder(Norms *this,UnicodeString *mapping,BuilderReorderingBuffer *buffer)

{
  int iVar1;
  ushort uVar2;
  Norm *pNVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  uint c;
  char16_t *pcVar7;
  
  uVar2 = (mapping->fUnion).fStackFields.fLengthAndFlags;
  if ((short)uVar2 < 0) {
    iVar6 = (mapping->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)(short)uVar2 >> 5;
  }
  if (((int)(short)uVar2 & 0x11U) == 0) {
    if ((uVar2 & 2) == 0) {
      pcVar7 = (mapping->fUnion).fFields.fArray;
    }
    else {
      pcVar7 = (char16_t *)((long)&mapping->fUnion + 2);
    }
  }
  else {
    pcVar7 = (char16_t *)0x0;
  }
  if (0 < iVar6) {
    iVar4 = 0;
    do {
      iVar1 = iVar4 + 1;
      c = (uint)(ushort)pcVar7[iVar4];
      if ((((c & 0xfc00) == 0xd800) && (iVar1 != iVar6)) &&
         (((ushort)pcVar7[iVar1] & 0xfc00) == 0xdc00)) {
        c = (uint)(ushort)pcVar7[iVar4] * 0x400 + (uint)(ushort)pcVar7[iVar1] + 0xfca02400;
        iVar1 = iVar4 + 2;
      }
      iVar4 = iVar1;
      pNVar3 = this->norms;
      uVar5 = umutablecptrie_get_63(this->normTrie,c);
      BuilderReorderingBuffer::append(buffer,c,pNVar3[uVar5].cc);
    } while (iVar4 < iVar6);
  }
  if (buffer->fDidReorder != '\0') {
    BuilderReorderingBuffer::toString(buffer,mapping);
    return;
  }
  return;
}

Assistant:

void Norms::reorder(UnicodeString &mapping, BuilderReorderingBuffer &buffer) const {
    int32_t length=mapping.length();
    U_ASSERT(length<=Normalizer2Impl::MAPPING_LENGTH_MASK);
    const char16_t *s=mapping.getBuffer();
    int32_t i=0;
    UChar32 c;
    while(i<length) {
        U16_NEXT(s, i, length, c);
        buffer.append(c, getCC(c));
    }
    if(buffer.didReorder()) {
        buffer.toString(mapping);
    }
}